

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O1

void __thiscall
cmExportFileGenerator::SetImportDetailProperties
          (cmExportFileGenerator *this,string *config,string *suffix,cmGeneratorTarget *target,
          ImportPropertyMap *properties)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint __val;
  cmMakefile *this_00;
  pointer pbVar2;
  pointer pbVar3;
  char cVar4;
  bool bVar5;
  char cVar6;
  TargetType TVar7;
  ManagedType MVar8;
  mapped_type *pmVar9;
  cmLinkInterface *pcVar10;
  cmValue cVar11;
  uint uVar12;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string prop;
  string prop_1;
  string value;
  key_type local_c8;
  pointer local_a8;
  undefined8 local_a0;
  string local_98;
  ImportPropertyMap *local_78;
  string *local_70;
  string *local_68;
  undefined1 local_60 [8];
  char *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  _Base_ptr local_40;
  size_t local_38;
  
  this_00 = target->Makefile;
  local_78 = properties;
  local_70 = suffix;
  local_68 = config;
  TVar7 = cmGeneratorTarget::GetType(target);
  if (TVar7 != SHARED_LIBRARY) {
    TVar7 = cmGeneratorTarget::GetType(target);
    if (TVar7 != MODULE_LIBRARY) goto LAB_0050b11a;
  }
  bVar5 = cmGeneratorTarget::IsDLLPlatform(target);
  if (!bVar5) {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    local_c8._M_string_length = 0;
    local_c8.field_2._M_allocated_capacity =
         local_c8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_58 = (char *)0x0;
    local_50._M_allocated_capacity = local_50._M_allocated_capacity & 0xffffffffffffff00;
    local_60 = (undefined1  [8])&local_50;
    bVar5 = cmGeneratorTarget::HasSOName(target,local_68);
    if (bVar5) {
      paVar1 = &local_98.field_2;
      local_98._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"CMAKE_PLATFORM_HAS_INSTALLNAME","");
      bVar5 = cmMakefile::IsOn(this_00,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (bVar5) {
        (*this->_vptr_cmExportFileGenerator[0x15])(&local_98,this,target,local_68);
        std::__cxx11::string::operator=((string *)local_60,(string *)&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar1) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::string::_M_replace
                ((ulong)&local_c8,0,(char *)local_c8._M_string_length,0x8e1fa1);
      cmGeneratorTarget::GetSOName(&local_98,target,local_68,RuntimeBinaryArtifact);
      std::__cxx11::string::_M_append(local_60,(ulong)local_98._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::string::_M_replace
                ((ulong)&local_c8,0,(char *)local_c8._M_string_length,0x8e1fb1);
      std::__cxx11::string::_M_replace((ulong)local_60,0,local_58,0x903148);
    }
    std::__cxx11::string::_M_append((char *)&local_c8,(ulong)(local_70->_M_dataplus)._M_p);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_78,&local_c8);
    std::__cxx11::string::_M_assign((string *)pmVar9);
    if (local_60 != (undefined1  [8])&local_50) {
      operator_delete((void *)local_60,(ulong)(local_50._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
LAB_0050b11a:
  pcVar10 = cmGeneratorTarget::GetLinkInterface(target,local_68,target);
  if (pcVar10 != (cmLinkInterface *)0x0) {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,"IMPORTED_LINK_INTERFACE_LANGUAGES","");
    SetImportLinkProperty<std::__cxx11::string>
              (this,local_70,target,&local_c8,&pcVar10->Languages,local_78,No);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    pbVar2 = (this->MissingTargets).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar3 = (this->MissingTargets).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::
    _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
    ::_Rb_tree((_Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                *)local_60,&(this->ExternalTargets)._M_t);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,"IMPORTED_LINK_DEPENDENT_LIBRARIES","");
    SetImportLinkProperty<cmLinkItem>
              (this,local_70,target,&local_c8,&pcVar10->SharedDeps,local_78,Yes);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&this->MissingTargets,(long)pbVar2 - (long)pbVar3 >> 5);
    std::
    _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
    ::clear(&(this->ExternalTargets)._M_t);
    if ((_Base_ptr)local_50._M_allocated_capacity != (_Base_ptr)0x0) {
      (this->ExternalTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           (_Rb_tree_color)local_58;
      (this->ExternalTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)local_50._M_allocated_capacity;
      (this->ExternalTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)local_50._8_8_;
      (this->ExternalTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_40;
      *(_Rb_tree_header **)(local_50._M_allocated_capacity + 8) =
           &(this->ExternalTargets)._M_t._M_impl.super__Rb_tree_header;
      (this->ExternalTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = local_38;
      local_50._M_allocated_capacity = 0;
      local_38 = 0;
      local_50._8_8_ = (_Base_ptr)&local_58;
      local_40 = (_Base_ptr)&local_58;
    }
    if (pcVar10->Multiplicity != 0) {
      local_c8._M_dataplus._M_p = (pointer)0x24;
      local_c8._M_string_length = 0x8e2008;
      local_c8.field_2._M_allocated_capacity = 0;
      local_a8 = (local_70->_M_dataplus)._M_p;
      local_c8.field_2._8_8_ = local_70->_M_string_length;
      local_a0 = 0;
      views._M_len = 2;
      views._M_array = (iterator)&local_c8;
      cmCatViews(&local_98,views);
      __val = pcVar10->Multiplicity;
      cVar6 = '\x01';
      if (9 < __val) {
        uVar12 = __val;
        cVar4 = '\x04';
        do {
          cVar6 = cVar4;
          if (uVar12 < 100) {
            cVar6 = cVar6 + -2;
            goto LAB_0050b344;
          }
          if (uVar12 < 1000) {
            cVar6 = cVar6 + -1;
            goto LAB_0050b344;
          }
          if (uVar12 < 10000) goto LAB_0050b344;
          bVar5 = 99999 < uVar12;
          uVar12 = uVar12 / 10000;
          cVar4 = cVar6 + '\x04';
        } while (bVar5);
        cVar6 = cVar6 + '\x01';
      }
LAB_0050b344:
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_c8,cVar6);
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_c8._M_dataplus._M_p,(uint)local_c8._M_string_length,__val);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](local_78,&local_98);
      std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
    }
    std::
    _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
    ::~_Rb_tree((_Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                 *)local_60);
  }
  MVar8 = cmGeneratorTarget::GetManagedType(target,local_68);
  if (MVar8 != Native) {
    local_c8._M_dataplus._M_p = (pointer)0x20;
    local_c8._M_string_length = 0x8e202d;
    local_c8.field_2._M_allocated_capacity = 0;
    local_a8 = (local_70->_M_dataplus)._M_p;
    local_c8.field_2._8_8_ = local_70->_M_string_length;
    local_a0 = 0;
    views_00._M_len = 2;
    views_00._M_array = (iterator)&local_c8;
    cmCatViews((string *)local_60,views_00);
    local_c8._M_string_length = 0;
    local_c8.field_2._M_allocated_capacity =
         local_c8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"COMMON_LANGUAGE_RUNTIME","");
    cVar11 = cmGeneratorTarget::GetProperty(target,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (cVar11.Value == (string *)0x0) {
      bVar5 = cmGeneratorTarget::IsCSharpOnly(target);
      if (bVar5) {
        std::__cxx11::string::_M_replace
                  ((ulong)&local_c8,0,(char *)local_c8._M_string_length,0x8b0297);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_c8);
    }
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_78,(key_type *)local_60);
    std::__cxx11::string::_M_assign((string *)pmVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if (local_60 != (undefined1  [8])&local_50) {
      operator_delete((void *)local_60,(ulong)(local_50._M_allocated_capacity + 1));
    }
  }
  return;
}

Assistant:

void cmExportFileGenerator::SetImportDetailProperties(
  const std::string& config, std::string const& suffix,
  cmGeneratorTarget* target, ImportPropertyMap& properties)
{
  // Get the makefile in which to lookup target information.
  cmMakefile* mf = target->Makefile;

  // Add the soname for unix shared libraries.
  if (target->GetType() == cmStateEnums::SHARED_LIBRARY ||
      target->GetType() == cmStateEnums::MODULE_LIBRARY) {
    if (!target->IsDLLPlatform()) {
      std::string prop;
      std::string value;
      if (target->HasSOName(config)) {
        if (mf->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {
          value = this->InstallNameDir(target, config);
        }
        prop = "IMPORTED_SONAME";
        value += target->GetSOName(config);
      } else {
        prop = "IMPORTED_NO_SONAME";
        value = "TRUE";
      }
      prop += suffix;
      properties[prop] = value;
    }
  }

  // Add the transitive link dependencies for this configuration.
  if (cmLinkInterface const* iface =
        target->GetLinkInterface(config, target)) {
    this->SetImportLinkProperty(
      suffix, target, "IMPORTED_LINK_INTERFACE_LANGUAGES", iface->Languages,
      properties, ImportLinkPropertyTargetNames::No);

    // Export IMPORTED_LINK_DEPENDENT_LIBRARIES to help consuming linkers
    // find private dependencies of shared libraries.
    std::size_t oldMissingTargetsSize = this->MissingTargets.size();
    auto oldExternalTargets = this->ExternalTargets;
    this->SetImportLinkProperty(
      suffix, target, "IMPORTED_LINK_DEPENDENT_LIBRARIES", iface->SharedDeps,
      properties, ImportLinkPropertyTargetNames::Yes);
    // Avoid enforcing shared library private dependencies as public package
    // dependencies by ignoring missing targets added for them.
    this->MissingTargets.resize(oldMissingTargetsSize);
    this->ExternalTargets = std::move(oldExternalTargets);

    if (iface->Multiplicity > 0) {
      std::string prop =
        cmStrCat("IMPORTED_LINK_INTERFACE_MULTIPLICITY", suffix);
      properties[prop] = std::to_string(iface->Multiplicity);
    }
  }

  // Add information if this target is a managed target
  if (target->GetManagedType(config) !=
      cmGeneratorTarget::ManagedType::Native) {
    std::string prop = cmStrCat("IMPORTED_COMMON_LANGUAGE_RUNTIME", suffix);
    std::string propval;
    if (cmValue p = target->GetProperty("COMMON_LANGUAGE_RUNTIME")) {
      propval = *p;
    } else if (target->IsCSharpOnly()) {
      // C# projects do not have the /clr flag, so we set the property
      // here to mark the target as (only) managed (i.e. no .lib file
      // to link to). Otherwise the  COMMON_LANGUAGE_RUNTIME target
      // property would have to be set manually for C# targets to make
      // exporting/importing work.
      propval = "CSharp";
    }
    properties[prop] = propval;
  }
}